

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message.cpp
# Opt level: O0

bool __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessage::operator==
          (DataDictionaryMessage *this,DataDictionaryMessage *that)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  const_reference this_00;
  const_reference that_00;
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  local_40;
  ulong local_28;
  size_t i;
  DataDictionaryMessage *that_local;
  DataDictionaryMessage *this_local;
  
  i = (size_t)that;
  that_local = this;
  bVar2 = IsUpdate(this);
  bVar3 = IsUpdate((DataDictionaryMessage *)i);
  if (bVar2 == bVar3) {
    for (local_28 = 0; uVar1 = local_28,
        sVar4 = std::
                vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                ::size(&this->field_defs_), uVar1 < sVar4; local_28 = local_28 + 1) {
      this_00 = std::
                vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                ::at(&this->field_defs_,local_28);
      GetFieldDefs(&local_40,(DataDictionaryMessage *)i);
      that_00 = std::
                vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                ::at(&local_40,local_28);
      bVar2 = FieldDef::operator!=(this_00,that_00);
      std::
      vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
      ::~vector(&local_40);
      if (bVar2) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DataDictionaryMessage::operator==(const DataDictionaryMessage& that) const
{
    if (IsUpdate()!= that.IsUpdate())
    {
        return false;
    }

    for (size_t i = 0; i < field_defs_.size(); i++)
    {
        if (field_defs_.at(i) != that.GetFieldDefs().at(i))
        {
            return false;
        }
    }

    return true;
}